

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O2

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
          *m,PositionMeasurement<float> *z)

{
  float *cov;
  undefined1 local_c8 [8];
  SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> sigmaMeasurementPoints;
  undefined1 local_70 [8];
  KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> K;
  Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> P_yy;
  undefined1 local_40 [8];
  PositionMeasurement<float> y;
  
  y.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       (Vector<float,_2>)(Vector<float,_2>)z;
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeMeasurementPrediction<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)local_40,
             (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              *)this,(SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)m);
  cov = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array + 4;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)local_40,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_c8,
             &(m->super_StandardBase<KalmanExamples::Robot1::PositionMeasurement<float>_>).P,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (PositionMeasurement<float> *)local_40,
             (SigmaPoints<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_c8,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_70);
  sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
  m_data.array._48_8_ = (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_70;
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_0>_>
              *)(sigmaMeasurementPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                 m_storage.m_data.array + 0xc));
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::PositionMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::PositionMeasurement<float>_> *)local_70,
             (Covariance<KalmanExamples::Robot1::PositionMeasurement<float>_> *)cov);
  return (State *)this;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }